

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseAST.cpp
# Opt level: O3

string * __thiscall
antlr::BaseAST::toStringTree_abi_cxx11_(string *__return_storage_ptr__,BaseAST *this)

{
  AST *pAVar1;
  ASTRefCount<antlr::AST> local_48 [2];
  ASTRef local_38;
  ASTRefCount<antlr::AST> local_28;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  (*(this->super_AST)._vptr_AST[0xd])(local_48,this);
  if (local_48[0].ref == (ASTRef *)0x0) {
    ASTRefCount<antlr::AST>::~ASTRefCount(local_48);
  }
  else {
    pAVar1 = (local_48[0].ref)->ptr;
    ASTRefCount<antlr::AST>::~ASTRefCount(local_48);
    if (pAVar1 != (AST *)0x0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      (*(this->super_AST)._vptr_AST[0x18])(local_48,this);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0].ref);
      if (local_48[0].ref != &local_38) {
        operator_delete(local_48[0].ref,(ulong)((long)&(local_38.ptr)->_vptr_AST + 1));
      }
      (*(this->super_AST)._vptr_AST[0xd])(&local_28,this);
      (*(local_28.ref)->ptr->_vptr_AST[0x19])(local_48);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0].ref);
      if (local_48[0].ref != &local_38) {
        operator_delete(local_48[0].ref,(ulong)((long)&(local_38.ptr)->_vptr_AST + 1));
      }
      ASTRefCount<antlr::AST>::~ASTRefCount(&local_28);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      return __return_storage_ptr__;
    }
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  (*(this->super_AST)._vptr_AST[0x18])(local_48,this);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0].ref);
  if (local_48[0].ref != &local_38) {
    operator_delete(local_48[0].ref,(ulong)((long)&(local_38.ptr)->_vptr_AST + 1));
  }
  return __return_storage_ptr__;
}

Assistant:

string BaseAST::toStringTree() const
{
	ANTLR_USE_NAMESPACE(std)string ts = "";

	if (getFirstChild())
	{
		ts+=" ( ";
		ts+=toString();
		ts+=getFirstChild()->toStringList();
		ts+=" )";
	}
	else
	{
		ts+=" ";
		ts+=toString();
	}
	return ts;
}